

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O1

QFixed __thiscall
QTextDocumentLayoutPrivate::blockIndent
          (QTextDocumentLayoutPrivate *this,QTextBlockFormat *blockFormat)

{
  QPaintDevice *pQVar1;
  int iVar2;
  int iVar3;
  QTextObject *pQVar4;
  long in_FS_OFFSET;
  qreal qVar5;
  double dVar6;
  double local_50;
  QTextFormat local_40;
  QTextFormat local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QTextFormat::intProperty(&blockFormat->super_QTextFormat,0x1040);
  local_50 = (double)iVar2;
  pQVar4 = QTextDocument::objectForFormat
                     ((this->super_QAbstractTextDocumentLayoutPrivate).document,
                      &blockFormat->super_QTextFormat);
  if (pQVar4 != (QTextObject *)0x0) {
    QTextObject::format((QTextObject *)&local_40);
    QTextFormat::toListFormat(&local_30);
    iVar2 = QTextFormat::intProperty(&local_30,0x3001);
    local_50 = local_50 + (double)iVar2;
    QTextFormat::~QTextFormat(&local_30);
    QTextFormat::~QTextFormat(&local_40);
  }
  iVar2 = 0;
  if ((local_50 != 0.0) || (NAN(local_50))) {
    pQVar1 = (this->super_QAbstractTextDocumentLayoutPrivate).paintDevice;
    if (pQVar1 == (QPaintDevice *)0x0) {
      dVar6 = 1.0;
    }
    else {
      iVar2 = (*pQVar1->_vptr_QPaintDevice[4])(pQVar1,8);
      iVar3 = qt_defaultDpi();
      dVar6 = (double)iVar2 / (double)iVar3;
    }
    qVar5 = QTextDocument::indentWidth((this->super_QAbstractTextDocumentLayoutPrivate).document);
    iVar2 = (int)(qVar5 * local_50 * dVar6 * 64.0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QFixed)iVar2;
  }
  __stack_chk_fail();
}

Assistant:

QFixed QTextDocumentLayoutPrivate::blockIndent(const QTextBlockFormat &blockFormat) const
{
    qreal indent = blockFormat.indent();

    QTextObject *object = document->objectForFormat(blockFormat);
    if (object)
        indent += object->format().toListFormat().indent();

    if (qIsNull(indent))
        return 0;

    qreal scale = 1;
    if (paintDevice) {
        scale = qreal(paintDevice->logicalDpiY()) / qreal(qt_defaultDpi());
    }

    return QFixed::fromReal(indent * scale * document->indentWidth());
}